

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O0

void __thiscall cmCursesPathWidget::OnTab(cmCursesPathWidget *this,cmCursesMainForm *fm,WINDOW *w)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  int local_154;
  string local_f8 [32];
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  undefined1 local_a0 [8];
  string glob;
  allocator local_49;
  undefined1 local_48 [8];
  string cstr;
  FORM *form;
  WINDOW *w_local;
  cmCursesMainForm *fm_local;
  cmCursesPathWidget *this_local;
  
  pcVar3 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
  if (pcVar3 != (char *)0x0) {
    cstr.field_2._8_8_ = cmCursesForm::GetForm(&fm->super_cmCursesForm);
    form_driver((FORM_conflict *)cstr.field_2._8_8_,0x204);
    form_driver((FORM_conflict *)cstr.field_2._8_8_,0x205);
    pcVar3 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,pcVar3,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::__cxx11::string::find_last_not_of(local_48,0x8cc25b);
    std::__cxx11::string::substr((ulong)((long)&glob.field_2 + 8),(ulong)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)(glob.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(glob.field_2._M_local_buf + 8));
    bVar2 = std::operator!=(&this->LastString,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48);
    if (bVar2) {
      this->Cycle = false;
      this->CurrentIndex = 0;
      std::__cxx11::string::operator=((string *)&this->LastGlob,"");
    }
    std::__cxx11::string::string((string *)local_a0);
    if ((this->Cycle & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "*");
      std::__cxx11::string::operator=
                ((string *)local_a0,
                 (string *)
                 &dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__cxx11::string::operator=((string *)local_a0,(string *)&this->LastGlob);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8);
    cmSystemTools::SimpleGlob
              ((string *)local_a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8,
               -(uint)((this->super_cmCursesStringWidget).super_cmCursesWidget.Type == PATH));
    uVar1 = this->CurrentIndex;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8);
    if (uVar1 < sVar4) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8,this->CurrentIndex);
      std::__cxx11::string::operator=((string *)local_48,(string *)pvVar5);
    }
    std::__cxx11::string::size();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (*pcVar3 == '*') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_48);
      std::__cxx11::string::operator=((string *)local_48,local_f8);
      std::__cxx11::string::~string(local_f8);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_48);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)local_48,"/");
    }
    cmCursesStringWidget::SetString(&this->super_cmCursesStringWidget,(string *)local_48);
    if (w == (WINDOW *)0x0) {
      local_154 = -1;
    }
    else {
      local_154 = w->_maxy + 1;
    }
    wtouchln(w,0,local_154,1);
    wrefresh(w);
    form_driver((FORM_conflict *)cstr.field_2._8_8_,0x217);
    std::__cxx11::string::operator=((string *)&this->LastGlob,(string *)local_a0);
    std::__cxx11::string::operator=((string *)&this->LastString,(string *)local_48);
    this->Cycle = true;
    this->CurrentIndex = this->CurrentIndex + 1;
    uVar1 = this->CurrentIndex;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8);
    if (sVar4 <= uVar1) {
      this->CurrentIndex = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmCursesPathWidget::OnTab(cmCursesMainForm* fm, WINDOW* w)
{
  if ( !this->GetString() )
    {
    return;
    }
  FORM* form = fm->GetForm();
  form_driver(form, REQ_NEXT_FIELD);
  form_driver(form, REQ_PREV_FIELD);
  std::string cstr = this->GetString();
  cstr = cstr.substr(0, cstr.find_last_not_of(" \t\n\r")+1);
  if ( this->LastString != cstr )
    {
    this->Cycle = false;
    this->CurrentIndex = 0;
    this->LastGlob = "";
    }
  std::string glob;
  if ( this->Cycle )
    {
    glob = this->LastGlob;
    }
  else
    {
    glob = cstr + "*";
    }
  std::vector<std::string> dirs;

  cmSystemTools::SimpleGlob(glob, dirs, (this->Type == cmState::PATH?-1:0));
  if ( this->CurrentIndex < dirs.size() )
    {
    cstr = dirs[this->CurrentIndex];
    }
  if ( cstr[cstr.size()-1] == '*' )
    {
    cstr = cstr.substr(0, cstr.size()-1);
    }

  if ( cmSystemTools::FileIsDirectory(cstr) )
    {
    cstr += "/";
    }

  this->SetString(cstr);
  touchwin(w);
  wrefresh(w);
  form_driver(form, REQ_END_FIELD);
  this->LastGlob = glob;
  this->LastString = cstr;
  this->Cycle = true;
  this->CurrentIndex ++;
  if ( this->CurrentIndex >= dirs.size() )
    {
    this->CurrentIndex = 0;
    }
}